

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O2

double ucurr_getRoundingIncrementForUsage_63(UChar *currency,UCurrencyUsage usage,UErrorCode *ec)

{
  uint *puVar1;
  long lVar2;
  uint *puVar3;
  double dVar4;
  
  puVar1 = (uint *)_findMetaData(currency,ec);
  dVar4 = 0.0;
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    if (usage == UCURR_USAGE_STANDARD) {
      lVar2 = 4;
      puVar3 = puVar1;
    }
    else {
      if (usage != UCURR_USAGE_CASH) {
        *ec = U_UNSUPPORTED_ERROR;
        return 0.0;
      }
      lVar2 = 0xc;
      puVar3 = puVar1 + 2;
    }
    if ((ulong)*puVar3 < 10) {
      if (1 < *(int *)((long)puVar1 + lVar2)) {
        dVar4 = (double)*(int *)((long)puVar1 + lVar2) / (double)POW10[*puVar3];
      }
    }
    else {
      *ec = U_INVALID_FORMAT_ERROR;
    }
  }
  return dVar4;
}

Assistant:

U_DRAFT double U_EXPORT2
ucurr_getRoundingIncrementForUsage(const UChar* currency, const UCurrencyUsage usage, UErrorCode* ec) {
    double result = 0.0;

    const int32_t *data = _findMetaData(currency, *ec);
    if (U_SUCCESS(*ec)) {
        int32_t fracDigits;
        int32_t increment;
        switch (usage) {
            case UCURR_USAGE_STANDARD:
                fracDigits = data[0];
                increment = data[1];
                break;
            case UCURR_USAGE_CASH:
                fracDigits = data[2];
                increment = data[3];
                break;
            default:
                *ec = U_UNSUPPORTED_ERROR;
                return result;
        }

        // If the meta data is invalid, return 0.0
        if (fracDigits < 0 || fracDigits > MAX_POW10) {
            *ec = U_INVALID_FORMAT_ERROR;
        } else {
            // A rounding value of 0 or 1 indicates no rounding.
            if (increment >= 2) {
                // Return (increment) / 10^(fracDigits).  The only actual rounding data,
                // as of this writing, is CHF { 2, 5 }.
                result = double(increment) / POW10[fracDigits];
            }
        }
    }

    return result;
}